

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O2

nbt_node * nbt_find_by_path(nbt_node *tree,char *path)

{
  char *__s2;
  nbt_list *pnVar1;
  list_head *plVar2;
  int iVar3;
  nbt_node *pnVar4;
  size_t __n;
  
  if (tree == (nbt_node *)0x0) {
    __assert_fail("tree",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0x1c8,"nbt_node *nbt_find_by_path(nbt_node *, const char *)");
  }
  if (path == (char *)0x0) {
    __assert_fail("path",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0x1c9,"nbt_node *nbt_find_by_path(nbt_node *, const char *)");
  }
  for (__n = 0; (path[__n] != '\0' && (path[__n] != '.')); __n = __n + 1) {
  }
  __s2 = tree->name;
  if (__s2 == (char *)0x0) {
    if (__n != 0) {
      return (nbt_node *)0x0;
    }
  }
  else {
    iVar3 = strncmp(path,__s2,__n);
    if (iVar3 != 0) {
      return (nbt_node *)0x0;
    }
    if (__s2[__n] != '\0') {
      return (nbt_node *)0x0;
    }
  }
  if (path[__n] == '\0') {
    return tree;
  }
  if (1 < tree->type - TAG_LIST) {
    return (nbt_node *)0x0;
  }
  pnVar1 = (tree->payload).tag_list;
  plVar2 = &pnVar1->entry;
  do {
    plVar2 = plVar2->flink;
    if (plVar2 == &pnVar1->entry) {
      return (nbt_node *)0x0;
    }
    pnVar4 = nbt_find_by_path((nbt_node *)plVar2[-1].flink,path + __n + 1);
  } while (pnVar4 == (nbt_node *)0x0);
  return pnVar4;
}

Assistant:

nbt_node* nbt_find_by_path(nbt_node* tree, const char* path)
{
    assert(tree);
    assert(path);

    /* The end of the "current_name" piece. */
    size_t e = index_of(path, '.');

    bool names_match = partial_strcmp(path, e, tree->name) == 0;

    /* Names don't match. These aren't the droids you're looking for. */
    if(!names_match)                                         return NULL;

    /* We're a leaf node, and the names match. Wooo found it. */
    if(path[e] == '\0')                                     return tree;

    /*
     * Initial names match, but the string isn't at the end. We're expecting a
     * list, but haven't hit one.
     */
    if(tree->type != TAG_LIST && tree->type != TAG_COMPOUND) return NULL;

    /* At this point, the inital names match, and we're not at a leaf node. */

    struct list_head* pos;
    struct nbt_list* list = tree->type == TAG_LIST ? tree->payload.tag_list : tree->payload.tag_compound;
    list_for_each(pos, &list->entry)
    {
        struct nbt_list* elem = list_entry(pos, struct nbt_list, entry);
        nbt_node* r;

        if((r = nbt_find_by_path(elem->data, path + e + 1)) != NULL)
            return r;
    }

    /* Wasn't found in the list (or the current node isn't a list). Give up. */
    return NULL;
}